

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O2

Expression __thiscall
dynet::expr::detail::
f<dynet::Sum,std::vector<dynet::expr::Expression,std::allocator<dynet::expr::Expression>>>
          (detail *this,
          vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *xs)

{
  ComputationGraph *arguments;
  pointer pEVar1;
  pointer pEVar2;
  undefined8 extraout_RDX;
  Expression EVar3;
  vector<dynet::VariableIndex,_std::allocator<dynet::VariableIndex>_> xis;
  allocator_type local_3d;
  undefined4 local_3c;
  pointer local_38;
  
  pEVar2 = (xs->
           super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>).
           _M_impl.super__Vector_impl_data._M_start;
  arguments = pEVar2->pg;
  std::vector<dynet::VariableIndex,_std::allocator<dynet::VariableIndex>_>::vector
            ((vector<dynet::VariableIndex,_std::allocator<dynet::VariableIndex>_> *)
             &stack0xffffffffffffffc8,
             (long)(xs->
                   super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pEVar2 >> 4,&local_3d);
  pEVar1 = (xs->
           super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (pEVar2 = (xs->
                super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>
                )._M_impl.super__Vector_impl_data._M_start; pEVar2 != pEVar1; pEVar2 = pEVar2 + 1) {
    local_38->t = (pEVar2->i).t;
    local_38 = local_38 + 1;
  }
  ComputationGraph::
  add_function<dynet::Sum,std::vector<dynet::VariableIndex,std::allocator<dynet::VariableIndex>>>
            ((ComputationGraph *)&stack0xffffffffffffffc4,
             (vector<dynet::VariableIndex,_std::allocator<dynet::VariableIndex>_> *)arguments);
  *(ComputationGraph **)this = arguments;
  *(undefined4 *)(this + 8) = local_3c;
  std::_Vector_base<dynet::VariableIndex,_std::allocator<dynet::VariableIndex>_>::~_Vector_base
            ((_Vector_base<dynet::VariableIndex,_std::allocator<dynet::VariableIndex>_> *)
             &stack0xffffffffffffffc8);
  EVar3._8_8_ = extraout_RDX;
  EVar3.pg = (ComputationGraph *)this;
  return EVar3;
}

Assistant:

Expression f(const T& xs) {
    ComputationGraph *pg = xs.begin()->pg;
    std::vector<VariableIndex> xis(xs.size());
    int i = 0;
    for (auto xi = xs.begin(); xi != xs.end(); ++xi) xis[i++] = xi->i;
    return Expression(pg, pg->add_function<F>(xis));
  }